

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

longlong __thiscall chaiscript::Boxed_Number::get_as_checked<long_long>(Boxed_Number *this)

{
  Common_Types CVar1;
  bad_any_cast *this_00;
  Boxed_Number *this_local;
  
  CVar1 = get_common_type(&this->bv);
  switch(CVar1) {
  case t_int32:
    check_type<int,long_long>();
    this_local = (Boxed_Number *)get_as_aux<long_long,int>(&this->bv);
    break;
  case t_double:
    check_type<double,long_long>();
    this_local = (Boxed_Number *)get_as_aux<long_long,double>(&this->bv);
    break;
  case t_uint8:
    check_type<unsigned_char,long_long>();
    this_local = (Boxed_Number *)get_as_aux<long_long,unsigned_char>(&this->bv);
    break;
  case t_int8:
    check_type<signed_char,long_long>();
    this_local = (Boxed_Number *)get_as_aux<long_long,signed_char>(&this->bv);
    break;
  case t_uint16:
    check_type<unsigned_short,long_long>();
    this_local = (Boxed_Number *)get_as_aux<long_long,unsigned_short>(&this->bv);
    break;
  case t_int16:
    check_type<short,long_long>();
    this_local = (Boxed_Number *)get_as_aux<long_long,short>(&this->bv);
    break;
  case t_uint32:
    check_type<unsigned_int,long_long>();
    this_local = (Boxed_Number *)get_as_aux<long_long,unsigned_int>(&this->bv);
    break;
  case t_uint64:
    check_type<unsigned_long,long_long>();
    this_local = (Boxed_Number *)get_as_aux<long_long,unsigned_long>(&this->bv);
    break;
  case t_int64:
    check_type<long,long_long>();
    this_local = (Boxed_Number *)get_as_aux<long_long,long>(&this->bv);
    break;
  case t_float:
    check_type<float,long_long>();
    this_local = (Boxed_Number *)get_as_aux<long_long,float>(&this->bv);
    break;
  case t_long_double:
    check_type<long_double,long_long>();
    this_local = (Boxed_Number *)get_as_aux<long_long,long_double>(&this->bv);
    break;
  default:
    this_00 = (bad_any_cast *)__cxa_allocate_exception(8);
    memset(this_00,0,8);
    detail::exception::bad_any_cast::bad_any_cast(this_00);
    __cxa_throw(this_00,&detail::exception::bad_any_cast::typeinfo,
                detail::exception::bad_any_cast::~bad_any_cast);
  }
  return (longlong)this_local;
}

Assistant:

Target get_as_checked() const {
      switch (get_common_type(bv)) {
        case Common_Types::t_int32:
          check_type<int32_t, Target>();
          return get_as_aux<Target, int32_t>(bv);
        case Common_Types::t_uint8:
          check_type<uint8_t, Target>();
          return get_as_aux<Target, uint8_t>(bv);
        case Common_Types::t_int8:
          check_type<int8_t, Target>();
          return get_as_aux<Target, int8_t>(bv);
        case Common_Types::t_uint16:
          check_type<uint16_t, Target>();
          return get_as_aux<Target, uint16_t>(bv);
        case Common_Types::t_int16:
          check_type<int16_t, Target>();
          return get_as_aux<Target, int16_t>(bv);
        case Common_Types::t_uint32:
          check_type<uint32_t, Target>();
          return get_as_aux<Target, uint32_t>(bv);
        case Common_Types::t_uint64:
          check_type<uint64_t, Target>();
          return get_as_aux<Target, uint64_t>(bv);
        case Common_Types::t_int64:
          check_type<int64_t, Target>();
          return get_as_aux<Target, int64_t>(bv);
        case Common_Types::t_double:
          check_type<double, Target>();
          return get_as_aux<Target, double>(bv);
        case Common_Types::t_float:
          check_type<float, Target>();
          return get_as_aux<Target, float>(bv);
        case Common_Types::t_long_double:
          check_type<long double, Target>();
          return get_as_aux<Target, long double>(bv);
      }

      throw chaiscript::detail::exception::bad_any_cast();
    }